

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  Printer *pPVar1;
  long lVar2;
  Descriptor *pDVar3;
  Generator *this_00;
  bool bVar4;
  mapped_type *pmVar5;
  long lVar6;
  Syntax syntax;
  int i_00;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  char *pcVar8;
  char *pcVar9;
  int i;
  long lVar10;
  byte bVar11;
  allocator local_24a;
  allocator local_249;
  Descriptor *local_248;
  Generator *local_240;
  string options_string_1;
  string local_218;
  long local_1f8;
  string local_1f0;
  DescriptorProto edp;
  string options_string;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char required_function_arguments [91];
  
  bVar11 = 0;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print(this->printer_,"\n");
  pPVar1 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&edp,this,message_descriptor);
  io::Printer::Print(pPVar1,"$descriptor_name$ = _descriptor.Descriptor(\n","descriptor_name",
                     (string *)&edp);
  std::__cxx11::string::~string((string *)&edp);
  io::Printer::Indent(this->printer_);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&edp,"name",(allocator *)required_function_arguments);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::string((string *)&edp,"full_name",(allocator *)required_function_arguments);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::string((string *)&edp,"file",(allocator *)required_function_arguments);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&edp);
  pcVar8 = 
  "name=\'$name$\',\nfull_name=\'$full_name$\',\nfilename=None,\nfile=$file$,\ncontaining_type=None,\n"
  ;
  pcVar9 = required_function_arguments;
  for (lVar6 = 0x5b; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pcVar9 = *pcVar8;
    pcVar8 = pcVar8 + (ulong)bVar11 * -2 + 1;
    pcVar9 = pcVar9 + (ulong)bVar11 * -2 + 1;
  }
  io::Printer::Print(this->printer_,&m,required_function_arguments);
  PrintFieldsInDescriptor(this,message_descriptor);
  PrintExtensionsInDescriptor(this,message_descriptor);
  io::Printer::Print(this->printer_,"nested_types=[");
  lVar6 = 0;
  local_248 = message_descriptor;
  for (lVar10 = 0; lVar10 < *(int *)(local_248 + 0x48); lVar10 = lVar10 + 1) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)&edp,this,(Descriptor *)(*(long *)(local_248 + 0x50) + lVar6));
    io::Printer::Print(this->printer_,"$name$, ","name",(string *)&edp);
    std::__cxx11::string::~string((string *)&edp);
    lVar6 = lVar6 + 0xa8;
  }
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"enum_types=[\n");
  io::Printer::Indent(this->printer_);
  pDVar3 = local_248;
  lVar6 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(pDVar3 + 0x58); lVar10 = lVar10 + 1) {
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              ((string *)&edp,this,(EnumDescriptor *)(*(long *)(pDVar3 + 0x60) + lVar6));
    io::Printer::Print(this->printer_,(char *)edp.super_Message.super_MessageLite._vptr_MessageLite)
    ;
    io::Printer::Print(this->printer_,",\n");
    std::__cxx11::string::~string((string *)&edp);
    lVar6 = lVar6 + 0x38;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(pDVar3 + 0x20),&options_string);
  pPVar1 = this->printer_;
  std::__cxx11::string::string((string *)&options_string_1,"MessageOptions",&local_24a);
  OptionsValue((string *)&edp,this,&options_string_1,&options_string);
  pcVar8 = "False";
  if (0 < *(int *)(pDVar3 + 0x68)) {
    pcVar8 = "True";
  }
  std::__cxx11::string::string((string *)&local_218,pcVar8,&local_249);
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)*(uint *)(*(long *)(pDVar3 + 0x10) + 0x8c),
             syntax);
  io::Printer::Print(pPVar1,
                     "options=$options_value$,\nis_extendable=$extendable$,\nsyntax=\'$syntax$\'",
                     "options_value",(string *)&edp,"extendable",&local_218,"syntax",&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::~string((string *)&options_string_1);
  io::Printer::Print(this->printer_,",\n");
  io::Printer::Print(this->printer_,"extension_ranges=[");
  uVar7 = extraout_RDX;
  for (lVar6 = 0; lVar6 < *(int *)(local_248 + 0x68); lVar6 = lVar6 + 1) {
    lVar10 = *(long *)(local_248 + 0x70);
    pPVar1 = this->printer_;
    SimpleItoa_abi_cxx11_
              ((string *)&edp,(protobuf *)(ulong)*(uint *)(lVar10 + lVar6 * 8),(int)uVar7);
    SimpleItoa_abi_cxx11_
              (&options_string_1,(protobuf *)(ulong)*(uint *)(lVar10 + 4 + lVar6 * 8),i_00);
    io::Printer::Print(pPVar1,"($start$, $end$), ","start",(string *)&edp,"end",&options_string_1);
    std::__cxx11::string::~string((string *)&options_string_1);
    std::__cxx11::string::~string((string *)&edp);
    uVar7 = extraout_RDX_00;
  }
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"oneofs=[\n");
  io::Printer::Indent(this->printer_);
  lVar10 = 0;
  lVar6 = 0;
  local_240 = this;
  while (this_00 = local_240, pDVar3 = local_248, lVar6 < *(int *)(local_248 + 0x38)) {
    lVar2 = *(long *)(local_248 + 0x40);
    edp._internal_metadata_.
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_._0_4_ = 0;
    edp._has_bits_.has_bits_[0] = (uint32  [1])0x0;
    edp._cached_size_ = 0;
    edp.field_.super_RepeatedPtrFieldBase.arena_ = (Arena *)&edp._internal_metadata_;
    edp.field_.super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
    local_1f8 = lVar6;
    edp.field_.super_RepeatedPtrFieldBase._8_8_ = edp.field_.super_RepeatedPtrFieldBase.arena_;
    std::__cxx11::string::string((string *)&options_string_1,"name",(allocator *)&local_218);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&edp,&options_string_1);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&options_string_1);
    std::__cxx11::string::string((string *)&options_string_1,"full_name",(allocator *)&local_218);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&edp,&options_string_1);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&options_string_1);
    lVar6 = (lVar2 - *(long *)(*(long *)(lVar2 + 0x10 + lVar10) + 0x40)) + lVar10;
    SimpleItoa_abi_cxx11_
              (&options_string_1,(protobuf *)(lVar6 / 0x30 & 0xffffffff),(int)(lVar6 % 0x30));
    std::__cxx11::string::string((string *)&local_218,"index",(allocator *)&local_1f0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&edp,&local_218);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&options_string_1);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&options_string_1);
    std::__cxx11::string::string((string *)&local_218,"OneofOptions",&local_24a);
    MessageLite::SerializeAsString_abi_cxx11_(&local_1f0,*(MessageLite **)(lVar2 + 0x28 + lVar10));
    OptionsValue(&options_string_1,local_240,&local_218,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_218);
    bVar4 = std::operator==(&options_string_1,"None");
    if (bVar4) {
      std::__cxx11::string::string((string *)&local_218,"options",(allocator *)&local_1f0);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&local_218);
      std::__cxx11::string::assign((char *)pmVar5);
    }
    else {
      std::operator+(&local_218,", options=",&options_string_1);
      std::__cxx11::string::string((string *)&local_1f0,"options",&local_24a);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&local_1f0);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    std::__cxx11::string::~string((string *)&local_218);
    io::Printer::Print(local_240->printer_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&edp,
                       "_descriptor.OneofDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\',\n  index=$index$, containing_type=None, fields=[]$options$),\n"
                      );
    std::__cxx11::string::~string((string *)&options_string_1);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&edp);
    lVar10 = lVar10 + 0x30;
    lVar6 = local_1f8 + 1;
  }
  io::Printer::Outdent(local_240->printer_);
  io::Printer::Print(this_00->printer_,"],\n");
  DescriptorProto::DescriptorProto(&edp);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this_00,pDVar3,&edp);
  io::Printer::Outdent(this_00->printer_);
  io::Printer::Print(this_00->printer_,")\n");
  DescriptorProto::~DescriptorProto(&edp);
  std::__cxx11::string::~string((string *)&options_string);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  std::map<string, string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const string nested_name = ModuleLevelDescriptorName(
        *message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const string descriptor_name = ModuleLevelDescriptorName(
        *message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "options=$options_value$,\n"
      "is_extendable=$extendable$,\n"
      "syntax='$syntax$'",
      "options_value", OptionsValue("MessageOptions", options_string),
      "extendable", message_descriptor.extension_range_count() > 0 ?
                      "True" : "False",
      "syntax", StringifySyntax(message_descriptor.file()->syntax()));
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ",
                    "start", SimpleItoa(range->start),
                    "end", SimpleItoa(range->end));
  }
  printer_->Print("],\n");
  printer_->Print("oneofs=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.oneof_decl_count(); ++i) {
    const OneofDescriptor* desc = message_descriptor.oneof_decl(i);
    std::map<string, string> m;
    m["name"] = desc->name();
    m["full_name"] = desc->full_name();
    m["index"] = SimpleItoa(desc->index());
    string options_string =
        OptionsValue("OneofOptions", desc->options().SerializeAsString());
    if (options_string == "None") {
      m["options"] = "";
    } else {
      m["options"] = ", options=" + options_string;
    }
    printer_->Print(
        m,
        "_descriptor.OneofDescriptor(\n"
        "  name='$name$', full_name='$full_name$',\n"
        "  index=$index$, containing_type=None, fields=[]$options$),\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}